

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3_result_value(sqlite3_context *pCtx,sqlite3_value *pValue)

{
  u8 desiredEnc;
  Mem *pTo;
  ushort uVar1;
  int iVar2;
  
  pTo = pCtx->pOut;
  sqlite3VdbeMemCopy(pTo,pValue);
  desiredEnc = pCtx->enc;
  uVar1 = pTo->flags;
  if ((uVar1 & 2) == 0) {
    pTo->enc = desiredEnc;
  }
  else if (pTo->enc != desiredEnc) {
    sqlite3VdbeMemTranslate(pTo,desiredEnc);
    uVar1 = pTo->flags;
  }
  if ((uVar1 & 0x12) != 0) {
    iVar2 = pTo->n;
    if ((uVar1 >> 10 & 1) != 0) {
      iVar2 = iVar2 + (pTo->u).nZero;
    }
    if (pTo->db->aLimit[0] < iVar2) {
      pCtx->isError = 0x12;
      sqlite3VdbeMemSetStr(pCtx->pOut,"string or blob too big",-1,'\x01',(_func_void_void_ptr *)0x0)
      ;
      return;
    }
  }
  return;
}

Assistant:

SQLITE_API void sqlite3_result_value(sqlite3_context *pCtx, sqlite3_value *pValue){
  Mem *pOut;

#ifdef SQLITE_ENABLE_API_ARMOR
  if( pCtx==0 ) return;
  if( pValue==0 ){
    sqlite3_result_null(pCtx);
    return;
  }
#endif
  pOut = pCtx->pOut;
  assert( sqlite3_mutex_held(pCtx->pOut->db->mutex) );
  sqlite3VdbeMemCopy(pOut, pValue);
  sqlite3VdbeChangeEncoding(pOut, pCtx->enc);
  if( sqlite3VdbeMemTooBig(pOut) ){
    sqlite3_result_error_toobig(pCtx);
  }
}